

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanDynamicHeap.cpp
# Opt level: O3

MasterBlock __thiscall
Diligent::VulkanDynamicMemoryManager::AllocateMasterBlock
          (VulkanDynamicMemoryManager *this,OffsetType SizeInBytes,OffsetType Alignment)

{
  pointer pcVar1;
  ulong uVar2;
  OffsetType OVar3;
  OffsetType Alignment_00;
  MasterBlock MVar4;
  MasterBlock MVar5;
  char (*in_stack_ffffffffffffff98) [164];
  string _msg;
  OffsetType SizeInBytes_local;
  undefined4 local_34;
  undefined8 local_30;
  
  Alignment_00 = 0x400;
  if (Alignment != 0) {
    Alignment_00 = Alignment;
  }
  pcVar1 = (pointer)(this->super_MasterBlockListBasedManager).m_AllocationsMgr.m_MaxSize;
  SizeInBytes_local = SizeInBytes;
  if (pcVar1 < SizeInBytes) {
    OVar3 = 0;
    _msg._M_dataplus._M_p = pcVar1;
    LogError<false,char[35],unsigned_long,char[38],unsigned_long,char[45]>
              (false,"AllocateMasterBlock",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanDynamicHeap.cpp"
               ,0x96,(char (*) [35])"Requested dynamic allocation size ",&SizeInBytes_local,
               (char (*) [38])" exceeds maximum dynamic memory size ",(unsigned_long *)&_msg,
               (char (*) [45])". The app should increase dynamic heap size.");
LAB_0024ddb0:
    MVar4.Size = OVar3;
    MVar4.UnalignedOffset = 0xffffffffffffffff;
  }
  else {
    MVar4 = DynamicHeap::MasterBlockListBasedManager::AllocateMasterBlock
                      (&this->super_MasterBlockListBasedManager,SizeInBytes,Alignment_00);
    if (MVar4.UnalignedOffset == 0xffffffffffffffff) {
      std::chrono::_V2::system_clock::now();
      RenderDeviceVkImpl::IdleGPU(this->m_DeviceVk);
      MVar4 = DynamicHeap::MasterBlockListBasedManager::AllocateMasterBlock
                        (&this->super_MasterBlockListBasedManager,SizeInBytes,Alignment_00);
      OVar3 = MVar4.Size;
      if (MVar4.UnalignedOffset == 0xffffffffffffffff) {
        local_34 = 1;
        local_30 = 0x7ff8000000000000;
        FormatString<char[54],std::ios_base&(std::ios_base&),std::_Setprecision,double,char[164]>
                  (&_msg,(Diligent *)"Space in dynamic heap is exhausted! After idling for ",
                   (char (*) [54])std::fixed,(_func_ios_base_ptr_ios_base_ptr *)&local_34,
                   (_Setprecision *)&local_30,
                   (double *)
                   " ms still no space is available. Increase the size of the heap by setting EngineVkCreateInfo::DynamicHeapSize to a greater value or optimize dynamic resource usage"
                   ,in_stack_ffffffffffffff98);
        if (DebugMessageCallback != (undefined *)0x0) {
          (*(code *)DebugMessageCallback)(2,_msg._M_dataplus._M_p,0,0,0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_msg._M_dataplus._M_p != &_msg.field_2) {
          operator_delete(_msg._M_dataplus._M_p,_msg.field_2._M_allocated_capacity + 1);
        }
        goto LAB_0024ddb0;
      }
      FormatString<char[208]>
                (&_msg,(char (*) [208])
                       "Space in dynamic heap is almost exhausted. Allocation forced idling the GPU. Increase the size of the heap by setting EngineVkCreateInfo::DynamicHeapSize to a greater value or optimize dynamic resource usage"
                );
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(1,_msg._M_dataplus._M_p,0,0,0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_msg._M_dataplus._M_p != &_msg.field_2) {
        operator_delete(_msg._M_dataplus._M_p,_msg.field_2._M_allocated_capacity + 1);
      }
    }
    uVar2 = (this->super_MasterBlockListBasedManager).m_AllocationsMgr.m_MaxSize -
            (this->super_MasterBlockListBasedManager).m_AllocationsMgr.m_FreeSize;
    if (uVar2 < this->m_TotalPeakSize) {
      uVar2 = this->m_TotalPeakSize;
    }
    this->m_TotalPeakSize = uVar2;
  }
  MVar5.UnalignedOffset = MVar4.UnalignedOffset;
  MVar5.Size = MVar4.Size;
  return MVar5;
}

Assistant:

VulkanDynamicMemoryManager::MasterBlock VulkanDynamicMemoryManager::AllocateMasterBlock(OffsetType SizeInBytes, OffsetType Alignment)
{
    if (Alignment == 0)
        Alignment = MasterBlockAlignment;

    if (SizeInBytes > GetSize())
    {
        LOG_ERROR("Requested dynamic allocation size ", SizeInBytes,
                  " exceeds maximum dynamic memory size ", GetSize(),
                  ". The app should increase dynamic heap size.");
        return MasterBlock{};
    }

    auto Block = TBase::AllocateMasterBlock(SizeInBytes, Alignment);
    if (!Block.IsValid())
    {
        // Allocation failed. Try to wait for GPU to finish pending frames to release some space
        auto                          StartIdleTime   = std::chrono::high_resolution_clock::now();
        static constexpr const auto   SleepPeriod     = std::chrono::milliseconds(1);
        static constexpr const auto   MaxIdleDuration = std::chrono::duration<double>{60.0 / 1000.0}; // 60 ms
        std::chrono::duration<double> IdleDuration;
        Uint32                        SleepIterations = 0;
        while (!Block.IsValid() && IdleDuration < MaxIdleDuration)
        {
            m_DeviceVk.PurgeReleaseQueues();
            Block = TBase::AllocateMasterBlock(SizeInBytes, Alignment);
            if (!Block.IsValid())
            {
                std::this_thread::sleep_for(SleepPeriod);
                ++SleepIterations;
            }

            auto CurrTime = std::chrono::high_resolution_clock::now();
            IdleDuration  = std::chrono::duration_cast<std::chrono::duration<double>>(CurrTime - StartIdleTime);
        }

        if (!Block.IsValid())
        {
            // Last resort - idle GPU (there seems to have been a driver bug at some point: vkQueueWaitIdle() would deadlock and never return)
            m_DeviceVk.IdleGPU();
            Block = TBase::AllocateMasterBlock(SizeInBytes, Alignment);
            if (!Block.IsValid())
            {
                LOG_ERROR_MESSAGE("Space in dynamic heap is exhausted! After idling for ",
                                  std::fixed, std::setprecision(1), IdleDuration.count() * 1000.0,
                                  " ms still no space is available. Increase the size of the heap by setting "
                                  "EngineVkCreateInfo::DynamicHeapSize to a greater value or optimize dynamic resource usage");
            }
            else
            {
                LOG_WARNING_MESSAGE("Space in dynamic heap is almost exhausted. Allocation forced idling the GPU. "
                                    "Increase the size of the heap by setting EngineVkCreateInfo::DynamicHeapSize to a "
                                    "greater value or optimize dynamic resource usage");
            }
        }
        else
        {
            if (SleepIterations == 0)
            {
                LOG_WARNING_MESSAGE("Space in dynamic heap is almost exhausted forcing mid-frame shrinkage. "
                                    "Increase the size of the heap buffer by setting EngineVkCreateInfo::DynamicHeapSize to a "
                                    "greater value or optimize dynamic resource usage");
            }
            else
            {
                LOG_WARNING_MESSAGE("Space in dynamic heap is almost exhausted. Allocation forced wait time of ",
                                    std::fixed, std::setprecision(1), IdleDuration.count() * 1000.0,
                                    " ms. Increase the size of the heap by setting EngineVkCreateInfo::DynamicHeapSize "
                                    "to a greater value or optimize dynamic resource usage");
            }
        }
    }

    if (Block.IsValid())
    {
        m_TotalPeakSize = std::max(m_TotalPeakSize, GetUsedSize());
    }

    return Block;
}